

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.lex.cc
# Opt level: O3

yy_state_type yy_get_previous_state(void)

{
  short *psVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  pbVar3 = (byte *)spyytext;
  iVar2 = yy_start;
  if (spyytext < yy_c_buf_p) {
    do {
      if ((ulong)*pbVar3 == 0) {
        bVar4 = 1;
      }
      else {
        bVar4 = ""[*pbVar3];
      }
      lVar6 = (long)iVar2;
      if (yy_accept[lVar6] != 0) {
        yy_last_accepting_state = iVar2;
        yy_last_accepting_cpos = (char *)pbVar3;
      }
      uVar7 = (ulong)bVar4;
      lVar5 = (long)yy_base[lVar6] + uVar7;
      if (iVar2 != yy_chk[lVar5]) {
        do {
          psVar1 = yy_def + lVar6;
          lVar6 = (long)*psVar1;
          if (0x56 < lVar6) {
            bVar4 = ""[uVar7];
          }
          uVar7 = (ulong)bVar4;
          lVar5 = (long)yy_base[lVar6] + uVar7;
        } while (*psVar1 != yy_chk[lVar5]);
      }
      iVar2 = (int)yy_nxt[lVar5];
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (byte *)yy_c_buf_p);
  }
  return iVar2;
}

Assistant:

static yy_state_type yy_get_previous_state (void)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    
	yy_current_state = (yy_start);

	for ( yy_cp = (yytext_ptr) + YY_MORE_ADJ; yy_cp < (yy_c_buf_p); ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			(yy_last_accepting_state) = yy_current_state;
			(yy_last_accepting_cpos) = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 61 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}